

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_NtkOpt(Acb_Ntk_t *pNtk,Acb_Par_t *pPars)

{
  uint *puVar1;
  char cVar2;
  Acb_Par_t *pAVar3;
  int *piVar4;
  float *pfVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  Acb_Mfs_t *p;
  Vec_Int_t *pVVar9;
  int *piVar10;
  void *__s;
  Vec_Que_t *pVVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  size_t __size;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  double dVar28;
  timespec ts;
  
  p = Acb_MfsStart(pNtk,pPars);
  if (pPars->fVerbose != 0) {
    pAVar3 = p->pPars;
    pcVar16 = "Area";
    if (pAVar3->fArea == 0) {
      pcVar16 = "Delay";
    }
    printf("%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n"
           ,pcVar16,(ulong)(uint)pAVar3->nTfiLevMax,(ulong)(uint)pAVar3->nTfoLevMax,
           (ulong)(uint)pAVar3->nWinNodeMax,(ulong)(uint)pAVar3->nLutSize);
  }
  iVar7 = (pNtk->vObjType).nCap;
  iVar14 = (pNtk->vFanouts).nCap;
  if (iVar14 < iVar7) {
    pVVar9 = (pNtk->vFanouts).pArray;
    if (pVVar9 == (Vec_Int_t *)0x0) {
      pVVar9 = (Vec_Int_t *)malloc((long)iVar7 << 4);
    }
    else {
      pVVar9 = (Vec_Int_t *)realloc(pVVar9,(long)iVar7 << 4);
      iVar14 = (pNtk->vFanouts).nCap;
    }
    (pNtk->vFanouts).pArray = pVVar9;
    memset(pVVar9 + iVar14,0,(long)(iVar7 - iVar14) << 4);
    (pNtk->vFanouts).nCap = iVar7;
  }
  (pNtk->vFanouts).nSize = iVar7;
  iVar7 = (pNtk->vObjType).nSize;
  if (1 < iVar7) {
    lVar18 = 1;
    do {
      lVar13 = (long)iVar7;
      if (lVar13 <= lVar18) goto LAB_003804a8;
      if ((pNtk->vObjType).pArray[lVar18] != '\0') {
        if ((pNtk->vObjFans).nSize <= lVar18) {
LAB_003804c7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar14 = (pNtk->vObjFans).pArray[lVar18];
        lVar15 = (long)iVar14;
        if ((lVar15 < 0) || ((pNtk->vFanSto).nSize <= iVar14)) {
LAB_0038046a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar10 = (pNtk->vFanSto).pArray;
        if (0 < piVar10[lVar15]) {
          lVar13 = 0;
          do {
            iVar7 = piVar10[lVar15 + lVar13 + 1];
            if (((long)iVar7 < 0) || ((pNtk->vFanouts).nSize <= iVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            lVar13 = lVar13 + 1;
            Vec_IntPush((pNtk->vFanouts).pArray + iVar7,(int)lVar18);
          } while (lVar13 < piVar10[lVar15]);
          iVar7 = (pNtk->vObjType).nSize;
          lVar13 = (long)iVar7;
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar13);
  }
  uVar22 = (pNtk->vObjType).nCap;
  if ((pNtk->vObjFunc).nCap < (int)uVar22) {
    piVar10 = (pNtk->vObjFunc).pArray;
    if (piVar10 == (int *)0x0) {
      piVar10 = (int *)malloc((long)(int)uVar22 << 2);
    }
    else {
      piVar10 = (int *)realloc(piVar10,(long)(int)uVar22 << 2);
    }
    (pNtk->vObjFunc).pArray = piVar10;
    if (piVar10 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNtk->vObjFunc).nCap = uVar22;
  }
  if (0 < (int)uVar22) {
    memset((pNtk->vObjFunc).pArray,0xff,(ulong)uVar22 * 4);
  }
  (pNtk->vObjFunc).nSize = uVar22;
  iVar7 = (pNtk->vObjType).nCap;
  iVar14 = (pNtk->vCnfs).nCap;
  if (iVar14 < iVar7) {
    pVVar9 = (pNtk->vCnfs).pArray;
    if (pVVar9 == (Vec_Int_t *)0x0) {
      pVVar9 = (Vec_Int_t *)malloc((long)iVar7 << 4);
    }
    else {
      pVVar9 = (Vec_Int_t *)realloc(pVVar9,(long)iVar7 << 4);
      iVar14 = (pNtk->vCnfs).nCap;
    }
    (pNtk->vCnfs).pArray = pVVar9;
    memset(pVVar9 + iVar14,0,(long)(iVar7 - iVar14) << 4);
    (pNtk->vCnfs).nCap = iVar7;
  }
  (pNtk->vCnfs).nSize = iVar7;
  if (p->pPars->fArea == 0) {
    Acb_NtkUpdateTiming(pNtk,-1);
    pVVar11 = pNtk->vQue;
    iVar7 = pVVar11->nSize;
    while( true ) {
      if (iVar7 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      piVar10 = &pVVar11->nSize;
      if (iVar7 == 1) break;
      piVar4 = pVVar11->pHeap;
      iVar7 = piVar4[1];
      pfVar5 = *pVVar11->pCostsFlt;
      if (pfVar5 == (float *)0x0) {
        fVar24 = (float)iVar7;
      }
      else {
        fVar24 = pfVar5[iVar7];
      }
      if ((int)fVar24 < 1) break;
      piVar6 = pVVar11->pOrder;
      piVar6[iVar7] = -1;
      iVar14 = *piVar10;
      *piVar10 = iVar14 + -1;
      if (iVar14 + -1 == 1) {
        piVar4[1] = -1;
      }
      else {
        iVar8 = piVar4[(long)iVar14 + -1];
        piVar4[(long)iVar14 + -1] = -1;
        piVar4[1] = iVar8;
        piVar6[iVar8] = 1;
        if (pfVar5 == (float *)0x0) {
          fVar24 = (float)iVar8;
        }
        else {
          fVar24 = pfVar5[iVar8];
        }
        iVar14 = *piVar10;
        uVar22 = 1;
        if (2 < iVar14) {
          uVar19 = 2;
          uVar22 = 1;
          do {
            uVar17 = uVar19 | 1;
            uVar21 = uVar19;
            if ((int)uVar17 < iVar14) {
              if (pfVar5 == (float *)0x0) {
                fVar25 = (float)piVar4[(int)uVar19];
                fVar26 = (float)piVar4[(int)uVar17];
              }
              else {
                fVar25 = pfVar5[piVar4[(int)uVar19]];
                fVar26 = pfVar5[piVar4[(int)uVar17]];
              }
              if (fVar25 < fVar26) {
                uVar21 = uVar17;
              }
            }
            if (iVar14 <= (int)uVar21) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar14 = piVar4[(int)uVar21];
            if (pfVar5 == (float *)0x0) {
              fVar25 = (float)iVar14;
            }
            else {
              fVar25 = pfVar5[iVar14];
            }
            if (fVar25 <= fVar24) break;
            piVar4[(int)uVar22] = iVar14;
            piVar6[iVar14] = uVar22;
            uVar19 = uVar21 * 2;
            iVar14 = *piVar10;
            uVar22 = uVar21;
          } while ((int)uVar19 < iVar14);
        }
        piVar4[(int)uVar22] = iVar8;
        piVar6[iVar8] = uVar22;
      }
      if (iVar7 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      if ((pNtk->vObjType).nSize <= iVar7) {
LAB_003804a8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((pNtk->vObjType).pArray[iVar7] != '\0') {
        Acb_NtkOptNode(p,iVar7);
        pVVar11 = pNtk->vQue;
      }
      iVar7 = pVVar11->nSize;
    }
  }
  else {
    uVar22 = (pNtk->vObjType).nSize;
    iVar7 = (((int)uVar22 >> 5) + 1) - (uint)((uVar22 & 0x1f) == 0);
    if (iVar7 == 0) {
      __size = 0;
      __s = (void *)0x0;
    }
    else {
      __size = (long)iVar7 << 2;
      __s = malloc(__size);
    }
    memset(__s,0,__size);
    Acb_NtkUpdateLevelD(pNtk,-1);
    uVar12 = (ulong)(uint)(pNtk->vObjType).nSize;
    iVar14 = 2;
    do {
      if (1 < (int)uVar12) {
        uVar20 = 1;
        do {
          if ((long)(int)uVar12 <= (long)uVar20) goto LAB_003804a8;
          cVar2 = (pNtk->vObjType).pArray[uVar20];
          if (((cVar2 != '\0') && ((long)uVar20 < (long)(int)uVar22)) && ((byte)(cVar2 - 5U) < 0xfe)
             ) {
            if ((long)(iVar7 * 0x20) <= (long)uVar20) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            uVar19 = (uint)uVar20;
            uVar12 = uVar20 >> 5 & 0x7ffffff;
            if (((*(uint *)((long)__s + uVar12 * 4) >> (uVar19 & 0x1f) & 1) == 0) &&
               (iVar8 = Acb_NtkObjMffcEstimate(pNtk,uVar19), iVar14 <= iVar8)) {
              p->nNodes = p->nNodes + 1;
              do {
                iVar8 = Acb_NtkOptNode(p,uVar19);
                if (iVar8 == 0) break;
                if ((long)(pNtk->vObjFans).nSize <= (long)uVar20) goto LAB_003804c7;
                iVar8 = (pNtk->vObjFans).pArray[uVar20];
                if (((long)iVar8 < 0) || ((pNtk->vFanSto).nSize <= iVar8)) goto LAB_0038046a;
              } while ((pNtk->vFanSto).pArray[iVar8] != 0);
              puVar1 = (uint *)((long)__s + uVar12 * 4);
              *puVar1 = *puVar1 | 1 << ((byte)uVar20 & 0x1f);
            }
          }
          uVar20 = uVar20 + 1;
          uVar12 = (ulong)(pNtk->vObjType).nSize;
        } while ((long)uVar20 < (long)uVar12);
      }
      bVar23 = iVar14 != 0;
      iVar14 = iVar14 + -1;
    } while (bVar23);
    if (__s != (void *)0x0) {
      free(__s);
    }
  }
  if (pPars->fVerbose != 0) {
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar18 = -1;
    }
    else {
      lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeTotal = lVar18 - p->timeTotal;
    uVar22 = p->nWins;
    uVar19 = 1;
    if (1 < (int)uVar22) {
      uVar19 = uVar22;
    }
    iVar7 = 0x976dec;
    printf("Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n"
           ,(ulong)(uint)p->nNodes,(ulong)uVar22,(long)p->nWinsAll / (long)(int)uVar19 & 0xffffffff,
           (long)p->nDivsAll / (long)(int)uVar19 & 0xffffffff,
           (ulong)(uint)(p->nChanges[2] + p->nChanges[3] + p->nChanges[1] + p->nChanges[0]),
           (ulong)(uint)p->nChanges[0],(ulong)(uint)p->nChanges[1],(ulong)(uint)p->nChanges[2],
           (ulong)(uint)p->nChanges[3],(ulong)(uint)p->nOvers,(ulong)(uint)StrCount,
           (ulong)(uint)p->nTwoNodes);
    Abc_Print(iVar7,"%s =","Windowing  ");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar27);
    Abc_Print(iVar7,"%s =","CNF compute");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar27);
    Abc_Print(iVar7,"%s =","Make solver");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeSol * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeSol / 1000000.0,dVar27);
    Abc_Print(iVar7,"%s =","SAT solving");
    dVar27 = 0.0;
    if (p->timeTotal != 0) {
      dVar27 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeSat / 1000000.0,dVar27);
    Abc_Print(iVar7,"%s =","TOTAL      ");
    dVar27 = (double)p->timeTotal;
    dVar28 = 0.0;
    if (p->timeTotal != 0) {
      dVar28 = (dVar27 * 100.0) / dVar27;
    }
    Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar27 / 1000000.0,dVar28);
    fflush(_stdout);
  }
  Acb_MfsStop(p);
  StrCount = 0;
  return;
}

Assistant:

void Acb_NtkOpt( Acb_Ntk_t * pNtk, Acb_Par_t * pPars )
{
    Acb_Mfs_t * pMan = Acb_MfsStart( pNtk, pPars );
    if ( pPars->fVerbose )
        printf( "%s-optimization parameters: TfiLev(I) = %d  TfoLev(O) = %d  WinMax(W) = %d  LutSize = %d\n", 
            pMan->pPars->fArea ? "Area" : "Delay", pMan->pPars->nTfiLevMax, pMan->pPars->nTfoLevMax, pMan->pPars->nWinNodeMax, pMan->pPars->nLutSize );
    Acb_NtkCreateFanout( pNtk );  // fanout data structure
    Acb_NtkCleanObjFuncs( pNtk ); // SAT variables
    Acb_NtkCleanObjCnfs( pNtk );  // CNF representations
    if ( pMan->pPars->fArea )
    {
        int n = 0, iObj, RetValue, nNodes = Acb_NtkObjNumMax(pNtk);
        Vec_Bit_t * vVisited = Vec_BitStart( Acb_NtkObjNumMax(pNtk) );
        Acb_NtkUpdateLevelD( pNtk, -1 ); // compute forward logic level
        for ( n = 2; n >= 0; n-- )
            Acb_NtkForEachNode( pNtk, iObj )
                if ( iObj < nNodes && !Vec_BitEntry(vVisited, iObj) && Acb_NtkObjMffcEstimate(pNtk, iObj) >= n )
                {
                    pMan->nNodes++;
                    //if ( iObj != 103 )
                    //    continue;
                    //Acb_NtkOptNode( pMan, iObj );
                    while ( (RetValue = Acb_NtkOptNode(pMan, iObj)) && Acb_ObjFaninNum(pNtk, iObj) );                    
                    Vec_BitWriteEntry( vVisited, iObj, 1 );
                }
        Vec_BitFree( vVisited );
    }
    else
    {
        int Value;
        Acb_NtkUpdateTiming( pNtk, -1 ); // compute delay information
        while ( (Value = (int)Vec_QueTopPriority(pNtk->vQue)) > 0 )
        {
            int iObj = Vec_QuePop(pNtk->vQue);
            if ( !Acb_ObjType(pNtk, iObj) )
                continue;
            //if ( iObj != 103 )
            //    continue;
            //printf( "Trying node %4d (%4d) ", iObj, Value );
            Acb_NtkOptNode( pMan, iObj ); 
        }
    }
    if ( pPars->fVerbose )
    {
        pMan->timeTotal = Abc_Clock() - pMan->timeTotal;
        printf( "Node = %d  Win = %d (Ave = %d)  DivAve = %d   Change = %d  C = %d  N1 = %d  N2 = %d  N3 = %d   Over = %d  Str = %d  2Node = %d.\n", 
            pMan->nNodes, pMan->nWins, pMan->nWinsAll/Abc_MaxInt(1, pMan->nWins), pMan->nDivsAll/Abc_MaxInt(1, pMan->nWins),
            pMan->nChanges[0] + pMan->nChanges[1] + pMan->nChanges[2] + pMan->nChanges[3],
            pMan->nChanges[0], pMan->nChanges[1], pMan->nChanges[2], pMan->nChanges[3], pMan->nOvers, StrCount, pMan->nTwoNodes );
        ABC_PRTP( "Windowing  ", pMan->timeWin,    pMan->timeTotal );
        ABC_PRTP( "CNF compute", pMan->timeCnf,    pMan->timeTotal );
        ABC_PRTP( "Make solver", pMan->timeSol,    pMan->timeTotal );
        ABC_PRTP( "SAT solving", pMan->timeSat,    pMan->timeTotal );
//        ABC_PRTP( "  unsat    ", pMan->timeSatU,   pMan->timeTotal );
//        ABC_PRTP( "  sat      ", pMan->timeSatS,   pMan->timeTotal );
        ABC_PRTP( "TOTAL      ", pMan->timeTotal,  pMan->timeTotal );
        fflush( stdout );
    }
    Acb_MfsStop( pMan );
    StrCount = 0;
}